

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokFileDesc::add_source_line(CTcTokFileDesc *this,ulong linenum,ulong line_addr)

{
  ulong uVar1;
  void *pvVar2;
  long lVar3;
  undefined8 in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t new_alo;
  size_t siz;
  size_t idx;
  size_t page_idx;
  
  uVar1 = in_RSI >> 10;
  if (*(ulong *)(in_RDI + 0x50) <= uVar1) {
    lVar3 = uVar1 + 0x10;
    if (*(long *)(in_RDI + 0x48) == 0) {
      pvVar2 = malloc(lVar3 * 8);
      *(void **)(in_RDI + 0x48) = pvVar2;
    }
    else {
      pvVar2 = realloc(*(void **)(in_RDI + 0x48),lVar3 * 8);
      *(void **)(in_RDI + 0x48) = pvVar2;
    }
    memset((void *)(*(long *)(in_RDI + 0x48) + *(long *)(in_RDI + 0x50) * 8),0,
           (lVar3 - *(long *)(in_RDI + 0x50)) * 8);
    *(long *)(in_RDI + 0x50) = lVar3;
  }
  if (*(long *)(*(long *)(in_RDI + 0x48) + uVar1 * 8) == 0) {
    pvVar2 = malloc(0x2000);
    *(void **)(*(long *)(in_RDI + 0x48) + uVar1 * 8) = pvVar2;
    memset(*(void **)(*(long *)(in_RDI + 0x48) + uVar1 * 8),0,0x2000);
  }
  if (*(long *)(*(long *)(*(long *)(in_RDI + 0x48) + uVar1 * 8) + (in_RSI & 0x3ff) * 8) == 0) {
    *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x48) + uVar1 * 8) + (in_RSI & 0x3ff) * 8) = in_RDX
    ;
  }
  return;
}

Assistant:

void CTcTokFileDesc::add_source_line(ulong linenum, ulong line_addr)
{
    size_t page_idx;
    size_t idx;

    /* get the index of the page containing this source line */
    page_idx = linenum / TCTOK_SRC_PAGE_CNT;

    /* get the index of the entry within the page */
    idx = linenum % TCTOK_SRC_PAGE_CNT;

    /* 
     *   determine if our page index table is large enough, and expand it
     *   if not 
     */
    if (page_idx >= src_pages_alo_)
    {
        size_t siz;
        size_t new_alo;
        
        /* allocate or expand the source pages array */
        new_alo = page_idx + 16;
        siz = new_alo * sizeof(src_pages_[0]);
        if (src_pages_ == 0)
            src_pages_ = (CTcTokSrcPage **)t3malloc(siz);
        else
            src_pages_ = (CTcTokSrcPage **)t3realloc(src_pages_, siz);

        /* clear the new part */
        memset(src_pages_ + src_pages_alo_, 0,
               (new_alo - src_pages_alo_) * sizeof(src_pages_[0]));

        /* remember the new allocation size */
        src_pages_alo_ = new_alo;
    }

    /* if this page isn't allocated, do so now */
    if (src_pages_[page_idx] == 0)
    {
        /* allocate the new page */
        src_pages_[page_idx] = (CTcTokSrcPage *)
                               t3malloc(sizeof(CTcTokSrcPage));

        /* clear it */
        memset(src_pages_[page_idx], 0, sizeof(CTcTokSrcPage));
    }

    /* 
     *   if this source line entry has been previously set, don't change
     *   it; otherwise, store the new setting 
     */
    if (src_pages_[page_idx]->ofs[idx] == 0)
        src_pages_[page_idx]->ofs[idx] = line_addr;
}